

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lognormal_dist.hpp
# Opt level: O3

result_type_conflict3 * __thiscall
trng::lognormal_dist<long_double>::cdf
          (result_type_conflict3 *__return_storage_ptr__,lognormal_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *in_RAX;
  
  if ((longdouble)0 < x._0_10_) {
    logl();
    in_RAX = (result_type_conflict3 *)erfcl();
  }
  return in_RAX;
}

Assistant:

cdf(result_type x) const {
      if (x <= 0)
        return 0;
      return math::erfc(math::constants<result_type>::one_over_sqrt_2 * (P.mu() - math::ln(x)) /
                        P.sigma()) /
             2;
    }